

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_ref.hpp
# Opt level: O0

optional<debugger_type> __thiscall
type_safe::move<debugger_type>(type_safe *this,optional_xvalue_ref<debugger_type> *ref)

{
  bool bVar1;
  debugger_type *t;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  optional<typename_std::decay<debugger_type>::type> oVar3;
  optional<debugger_type> oVar4;
  optional_xvalue_ref<debugger_type> *ref_local;
  
  bVar1 = basic_optional<type_safe::reference_optional_storage<debugger_type,_true>_>::has_value
                    (ref);
  if (bVar1) {
    t = basic_optional<type_safe::reference_optional_storage<debugger_type,_true>_>::value(ref);
    oVar3 = make_optional<debugger_type>(this,t);
    uVar2 = oVar3.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage
            ._8_8_;
  }
  else {
    basic_optional<type_safe::direct_optional_storage<debugger_type>_>::basic_optional
              ((basic_optional<type_safe::direct_optional_storage<debugger_type>_> *)this);
    uVar2 = extraout_RDX;
  }
  oVar4.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.storage_
  [8] = (char)uVar2;
  oVar4.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.storage_
  [9] = (char)((ulong)uVar2 >> 8);
  oVar4.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.storage_
  [10] = (char)((ulong)uVar2 >> 0x10);
  oVar4.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.storage_
  [0xb] = (char)((ulong)uVar2 >> 0x18);
  oVar4.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.empty_ =
       (bool)(char)((ulong)uVar2 >> 0x20);
  oVar4.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage._13_3_ =
       (int3)((ulong)uVar2 >> 0x28);
  oVar4.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.storage_.
  _0_8_ = this;
  return (optional<debugger_type>)
         oVar4.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage;
}

Assistant:

optional<T> move(const optional_xvalue_ref<T>& ref) noexcept(
    std::is_nothrow_move_constructible<T>::value)
{
    return ref.has_value() ? type_safe::make_optional(ref.value()) : nullopt;
}